

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_constraint.cpp
# Opt level: O3

void __thiscall
Animation_Constraint::Init_Target_Value(Animation_Constraint *this,Am_Slot *new_slot)

{
  bool bVar1;
  Am_Slot_Key AVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Wrapper *in_value;
  Am_Value_List slots;
  Am_Object_Advanced obj;
  Am_Object owner;
  Am_Value_List targets;
  Am_Value_List local_70;
  Am_Object local_60;
  Animation_Constraint *local_58;
  Am_Object local_50;
  Am_Value_List local_48;
  Am_Slot local_38;
  
  if (this->must_initialize_instance == false) {
    local_58 = this;
    Am_Slot::Get_Owner((Am_Slot *)&local_70);
    Am_Object::Am_Object(&local_50,(Am_Object *)&local_70);
    Am_Object::~Am_Object((Am_Object *)&local_70);
    Am_Object::Am_Object(&local_60,&local_50);
    AVar2 = Am_Slot::Get_Key(new_slot);
    if (local_58->multi_slot == true) {
      local_48.data =
           (Am_Value_List_Data *)Am_Object_Advanced::Get_Slot(&local_58->interpolator,0xeb);
      pAVar4 = Am_Slot::Get((Am_Slot *)&local_48);
      Am_Value_List::Am_Value_List(&local_70,pAVar4);
      Am_Value_List::Am_Value_List(&local_48);
      Am_Value_List::Start(&local_70);
      while( true ) {
        bVar1 = Am_Value_List::Last(&local_70);
        if (bVar1) break;
        pAVar4 = Am_Value_List::Get(&local_70);
        iVar3 = Am_Value::operator_cast_to_int(pAVar4);
        if (AVar2 == (Am_Slot_Key)iVar3) {
          pAVar4 = Am_Slot::Get(new_slot);
        }
        else {
          local_38 = Am_Object_Advanced::Get_Slot
                               ((Am_Object_Advanced *)&local_60,(Am_Slot_Key)iVar3);
          pAVar4 = Am_Slot::Get(&local_38);
        }
        Am_Value_List::Add(&local_48,pAVar4,Am_TAIL,true);
        Am_Value_List::Next(&local_70);
      }
      in_value = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_48);
      Am_Value::operator=(&local_58->target,in_value);
      Am_Value_List::~Am_Value_List(&local_48);
      Am_Value_List::~Am_Value_List(&local_70);
    }
    else {
      local_70.data =
           (Am_Value_List_Data *)Am_Object_Advanced::Get_Slot(&local_58->interpolator,0xeb);
      pAVar4 = Am_Slot::Get((Am_Slot *)&local_70);
      iVar3 = Am_Value::operator_cast_to_int(pAVar4);
      if (AVar2 == (Am_Slot_Key)iVar3) {
        pAVar4 = Am_Slot::Get(new_slot);
      }
      else {
        local_70.data =
             (Am_Value_List_Data *)
             Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&local_60,(Am_Slot_Key)iVar3);
        pAVar4 = Am_Slot::Get((Am_Slot *)&local_70);
      }
      Am_Value::operator=(&local_58->target,pAVar4);
    }
    Am_Object::~Am_Object(&local_60);
    Am_Object::~Am_Object(&local_50);
  }
  return;
}

Assistant:

void
Animation_Constraint::Init_Target_Value(const Am_Slot &new_slot)
{
  if (must_initialize_instance)
    return;

  Am_Object owner = primary_slot.Get_Owner();
  Am_Object_Advanced obj = (Am_Object_Advanced &)owner;
  Am_Slot_Key key;
  Am_Slot_Key new_key = new_slot.Get_Key();

  if (multi_slot) {
    Am_Value_List slots = interpolator.Get_Slot(Am_SLOT_TO_ANIMATE).Get();
    Am_Value_List targets;

    for (slots.Start(); !slots.Last(); slots.Next()) {
      key = (int)slots.Get();
      targets.Add((key == new_key) ? new_slot.Get() : obj.Get_Slot(key).Get());
    }

    target = targets;
  } else {
    key = (int)interpolator.Get_Slot(Am_SLOT_TO_ANIMATE).Get();
    target = (key == new_key) ? new_slot.Get() : obj.Get_Slot(key).Get();
  }
}